

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool DeleteCoinsDBFromDisk(path *db_path,bool is_snapshot)

{
  byte bVar1;
  bool bVar2;
  byte in_SIL;
  long in_FS_OFFSET;
  bool destroyed;
  filesystem_error *e;
  bool existed;
  string path_str;
  path base_blockhash_path;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 uVar3;
  int in_stack_fffffffffffffe0c;
  char *in_stack_fffffffffffffe10;
  path *in_stack_fffffffffffffe18;
  path *in_stack_fffffffffffffe20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe34;
  undefined1 in_stack_fffffffffffffe35;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  LogFlags in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe7c;
  ConstevalFormatString<1U> in_stack_fffffffffffffeb8;
  string_view in_stack_fffffffffffffec0;
  string_view in_stack_fffffffffffffed0;
  Level in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  path local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
             (AnnotatedMixin<std::recursive_mutex> *)0x14b0960);
  if ((in_SIL & 1) != 0) {
    fs::path::path((path *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   (path *)0x14b0985);
    fs::operator/(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    bVar1 = std::filesystem::remove(&local_30);
    if ((bVar1 & 1) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffe10);
      in_stack_fffffffffffffe10 = "[snapshot] snapshot chainstate dir being removed lacks %s file\n"
      ;
      in_stack_fffffffffffffe08 = 2;
      LogPrintFormatInternal<std::__cxx11::string>
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec0,in_stack_fffffffffffffe7c,
                 in_stack_fffffffffffffe70,in_stack_ffffffffffffffb0,in_stack_fffffffffffffeb8,
                 in_stack_ffffffffffffffc0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    }
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  }
  fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffe10);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
  uVar3 = 2;
  LogPrintFormatInternal<std::__cxx11::string>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec0,in_stack_fffffffffffffe7c,
             in_stack_fffffffffffffe70,in_stack_ffffffffffffffb0,in_stack_fffffffffffffeb8,
             in_stack_ffffffffffffffc0);
  bVar2 = DestroyDB((string *)
                    CONCAT17(in_stack_fffffffffffffe37,
                             CONCAT16(in_stack_fffffffffffffe36,
                                      CONCAT15(in_stack_fffffffffffffe35,
                                               CONCAT14(in_stack_fffffffffffffe34,
                                                        in_stack_fffffffffffffe30)))));
  if (!bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
    uVar3 = 2;
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec0,in_stack_fffffffffffffe7c,
               in_stack_fffffffffffffe70,in_stack_ffffffffffffffb0,in_stack_fffffffffffffeb8,
               in_stack_ffffffffffffffc0);
  }
  bVar1 = 0;
  if (bVar2) {
    bVar2 = fs::exists((path *)CONCAT44(in_stack_fffffffffffffe0c,uVar3));
    bVar1 = bVar2 ^ 0xff;
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe0c,uVar3));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    AssertLockHeld(::cs_main);

    if (is_snapshot) {
        fs::path base_blockhash_path = db_path / node::SNAPSHOT_BLOCKHASH_FILENAME;

        try {
            bool existed = fs::remove(base_blockhash_path);
            if (!existed) {
                LogPrintf("[snapshot] snapshot chainstate dir being removed lacks %s file\n",
                          fs::PathToString(node::SNAPSHOT_BLOCKHASH_FILENAME));
            }
        } catch (const fs::filesystem_error& e) {
            LogPrintf("[snapshot] failed to remove file %s: %s\n",
                    fs::PathToString(base_blockhash_path), fsbridge::get_filesystem_error_message(e));
        }
    }

    std::string path_str = fs::PathToString(db_path);
    LogPrintf("Removing leveldb dir at %s\n", path_str);

    // We have to destruct before this call leveldb::DB in order to release the db
    // lock, otherwise `DestroyDB` will fail. See `leveldb::~DBImpl()`.
    const bool destroyed = DestroyDB(path_str);

    if (!destroyed) {
        LogPrintf("error: leveldb DestroyDB call failed on %s\n", path_str);
    }

    // Datadir should be removed from filesystem; otherwise initialization may detect
    // it on subsequent statups and get confused.
    //
    // If the base_blockhash_path removal above fails in the case of snapshot
    // chainstates, this will return false since leveldb won't remove a non-empty
    // directory.
    return destroyed && !fs::exists(db_path);
}